

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModifiedPage.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
PDFModifiedPage::WriteModifiedResourcesDict_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,PDFModifiedPage *this,PDFParser *inParser,
          PDFDictionary *inResourcesDictionary,ObjectsContext *inObjectContext,
          PDFDocumentCopyingContext *inCopyingContext)

{
  bool bVar1;
  uchar inCharCode;
  ObjectsContext *this_00;
  DictionaryContext *this_01;
  string *psVar2;
  DictionaryContext *ObjectsContext;
  PDFObject *inOriginal;
  PDFDocumentCopyingContext *this_02;
  int iVar3;
  ulong uVar4;
  pointer ppPVar5;
  int local_c4;
  string imageObjectName;
  PDFObjectCastPtr<PDFDictionary> existingXObjectDict;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  itExisting;
  string name;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  resourcesDictionaryIt;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PDFDictionary::GetIterator(&resourcesDictionaryIt,inResourcesDictionary);
  this_00 = PDFWriter::GetObjectsContext(this->mWriter);
  this_01 = ::ObjectsContext::StartDictionary(this_00);
  while( true ) {
    bVar1 = ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
            ::MoveNext(&resourcesDictionaryIt.
                        super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                      );
    if (!bVar1) break;
    psVar2 = PDFName::GetValue_abi_cxx11_
                       (*(PDFName **)
                         (resourcesDictionaryIt.
                          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                          .mCurrentPosition._M_node + 1));
    bVar1 = std::operator!=(psVar2,"XObject");
    if (bVar1) {
      psVar2 = PDFName::GetValue_abi_cxx11_
                         (*(PDFName **)
                           (resourcesDictionaryIt.
                            super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                            .mCurrentPosition._M_node + 1));
      DictionaryContext::WriteKey(this_01,psVar2);
      PDFDocumentCopyingContext::CopyDirectObjectAsIs
                (inCopyingContext,
                 (PDFObject *)
                 resourcesDictionaryIt.
                 super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                 .mCurrentPosition._M_node[1]._M_parent);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&imageObjectName,"XObject",(allocator<char> *)&name);
  DictionaryContext::WriteKey(this_01,&imageObjectName);
  std::__cxx11::string::~string((string *)&imageObjectName);
  ObjectsContext = ::ObjectsContext::StartDictionary(inObjectContext);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&imageObjectName,"XObject",(allocator<char> *)&name);
  inOriginal = PDFParser::QueryDictionaryObject(inParser,inResourcesDictionary,&imageObjectName);
  existingXObjectDict.super_RefCountPtr<PDFDictionary>.mValue =
       PDFObjectCast<PDFDictionary>(inOriginal);
  existingXObjectDict.super_RefCountPtr<PDFDictionary>._vptr_RefCountPtr =
       (_func_int **)&PTR__RefCountPtr_0036d8c0;
  std::__cxx11::string::~string((string *)&imageObjectName);
  imageObjectName._M_dataplus._M_p = (pointer)&imageObjectName.field_2;
  imageObjectName._M_string_length = 0;
  imageObjectName.field_2._M_local_buf[0] = '\0';
  if (existingXObjectDict.super_RefCountPtr<PDFDictionary>.mValue != (PDFDictionary *)0x0) {
    PDFDictionary::GetIterator
              (&itExisting,existingXObjectDict.super_RefCountPtr<PDFDictionary>.mValue);
    uVar4 = 1;
    while( true ) {
      bVar1 = ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
              ::MoveNext(&itExisting.
                          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                        );
      if (!bVar1) break;
      psVar2 = PDFName::GetValue_abi_cxx11_
                         (*(PDFName **)
                           (itExisting.
                            super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                            .mCurrentPosition._M_node + 1));
      std::__cxx11::string::string((string *)&name,(string *)psVar2);
      DictionaryContext::WriteKey(ObjectsContext,&name);
      this_02 = inCopyingContext;
      PDFDocumentCopyingContext::CopyDirectObjectAsIs
                (inCopyingContext,
                 (PDFObject *)
                 itExisting.
                 super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                 .mCurrentPosition._M_node[1]._M_parent);
      inCharCode = '9';
      if (uVar4 <= name._M_string_length) {
        inCharCode = name._M_dataplus._M_p[uVar4 - 1];
      }
      GetDifferentChar((PDFModifiedPage *)this_02,inCharCode);
      std::__cxx11::string::push_back((char)&imageObjectName);
      std::__cxx11::string::~string((string *)&name);
      uVar4 = uVar4 + 1;
    }
    ::ObjectsContext::EndLine(inObjectContext);
  }
  ppPVar5 = (this->mContenxts).
            super__Vector_base<PDFFormXObject_*,_std::allocator<PDFFormXObject_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::__cxx11::string::push_back((char)&imageObjectName);
  iVar3 = 0;
  for (; ppPVar5 !=
         (this->mContenxts).super__Vector_base<PDFFormXObject_*,_std::allocator<PDFFormXObject_*>_>.
         _M_impl.super__Vector_impl_data._M_finish; ppPVar5 = ppPVar5 + 1) {
    local_c4 = iVar3;
    BoxingBaseWithRW<int,STDStreamsReader<int>,STDStreamsWriter<int>>::ToString_abi_cxx11_
              ((string *)&itExisting,&local_c4);
    std::operator+(&name,&imageObjectName,(string *)&itExisting);
    std::__cxx11::string::~string((string *)&itExisting);
    DictionaryContext::WriteKey(ObjectsContext,&name);
    itExisting.
    super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
    .mEndPosition._M_node = (_Base_ptr)PDFFormXObject::GetObjectID(*ppPVar5);
    itExisting.
    super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
    .mFirstMove = false;
    itExisting.
    super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
    ._9_7_ = 0;
    DictionaryContext::WriteObjectReferenceValue(ObjectsContext,(ObjectReference *)&itExisting);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&name);
    std::__cxx11::string::~string((string *)&name);
    iVar3 = iVar3 + 1;
  }
  ::ObjectsContext::EndDictionary(inObjectContext,ObjectsContext);
  ::ObjectsContext::EndDictionary(inObjectContext,this_01);
  std::__cxx11::string::~string((string *)&imageObjectName);
  RefCountPtr<PDFDictionary>::~RefCountPtr(&existingXObjectDict.super_RefCountPtr<PDFDictionary>);
  return __return_storage_ptr__;
}

Assistant:

vector<string> PDFModifiedPage::WriteModifiedResourcesDict(PDFParser* inParser,PDFDictionary* inResourcesDictionary,ObjectsContext& inObjectContext,PDFDocumentCopyingContext* inCopyingContext)
{
	vector<string> formResourcesNames;

    MapIterator<PDFNameToPDFObjectMap>  resourcesDictionaryIt = inResourcesDictionary->GetIterator();
        
    // create modified page object
    DictionaryContext* dict = mWriter->GetObjectsContext().StartDictionary();
        
    // copy all elements of the page to the new page object, but the "Contents" and "Resources" elements
    while(resourcesDictionaryIt.MoveNext())
    {
        if(resourcesDictionaryIt.GetKey()->GetValue() != "XObject")
        {
            dict->WriteKey(resourcesDictionaryIt.GetKey()->GetValue());
            inCopyingContext->CopyDirectObjectAsIs(resourcesDictionaryIt.GetValue());
        }
    }   

    // now write a new xobject entry.
	dict->WriteKey("XObject");
	DictionaryContext* xobjectDict = inObjectContext.StartDictionary();

	PDFObjectCastPtr<PDFDictionary> existingXObjectDict(inParser->QueryDictionaryObject(inResourcesDictionary,"XObject"));
    string imageObjectName;
	if(existingXObjectDict.GetPtr())
	{
        // i'm having a very sophisticated algo here to create a new unique name. 
        // i'm making sure it's different in one letter from any name, using a well known discrete math proof method

		MapIterator<PDFNameToPDFObjectMap>  itExisting = existingXObjectDict->GetIterator();
		unsigned long i=0;
		while(itExisting.MoveNext())
		{
			string name = itExisting.GetKey()->GetValue();
			xobjectDict->WriteKey(name);
			inCopyingContext->CopyDirectObjectAsIs(itExisting.GetValue());
			imageObjectName.push_back((char)(GetDifferentChar((name.length() >= i+1) ? name[i]:0x39)));
			++i;
		}
		inObjectContext.EndLine();
	}

	PDFFormXObjectVector::iterator itForms = mContenxts.begin();
	imageObjectName.push_back('_');
	for(int i=0;itForms != mContenxts.end();++i,++itForms)
	{
		string formObjectName = imageObjectName + Int(i).ToString();
		xobjectDict->WriteKey(formObjectName);
		xobjectDict->WriteObjectReferenceValue((*itForms)->GetObjectID());
		formResourcesNames.push_back(formObjectName);
	}

	inObjectContext.EndDictionary(xobjectDict);
	inObjectContext.EndDictionary(dict);

	return formResourcesNames;
}